

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test7::getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,
          _variable_type output_variable_type,uint array_size)

{
  ostream *poVar1;
  _variable_type type;
  string output_variable_type_string;
  stringstream result_sstream;
  stringstream array_size_sstream;
  stringstream array_index_sstream;
  string local_510;
  string local_4f0 [32];
  string local_4d0 [32];
  stringstream local_4b0 [16];
  ostream local_4a0;
  stringstream local_328 [16];
  ostream local_318;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::stringstream::stringstream(local_328);
  std::__cxx11::stringstream::stringstream(local_4b0);
  Utils::getVariableTypeString_abi_cxx11_(&local_510,(Utils *)(ulong)output_variable_type,type);
  if (1 < array_size) {
    std::operator<<(&local_190,"[0]");
    poVar1 = std::operator<<(&local_318,"[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"]");
  }
  poVar1 = std::operator<<(&local_4a0,"#version 400\n\nout ");
  poVar1 = std::operator<<(poVar1,(string *)&local_510);
  poVar1 = std::operator<<(poVar1," test_output");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,local_4d0);
  poVar1 = std::operator<<(poVar1,";\n\nvoid main()\n{\n    test_output");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,local_4f0);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,(string *)&local_510);
  std::operator<<(poVar1,"(2.0);\n}\n");
  std::__cxx11::string::~string(local_4f0);
  std::__cxx11::string::~string(local_4d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::stringstream::~stringstream(local_4b0);
  std::__cxx11::stringstream::~stringstream(local_328);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getCodeOfFragmentShaderWithDoublePrecisionOutput(
	Utils::_variable_type output_variable_type, unsigned int array_size)
{
	std::stringstream array_index_sstream;
	std::stringstream array_size_sstream;
	std::stringstream result_sstream;
	std::string		  output_variable_type_string = Utils::getVariableTypeString(output_variable_type);

	if (array_size > 1)
	{
		array_index_sstream << "[0]";
		array_size_sstream << "[" << array_size << "]";
	}

	result_sstream << "#version 400\n"
					  "\n"
					  "out "
				   << output_variable_type_string << " test_output" << array_size_sstream.str() << ";\n"
																								   "\n"
																								   "void main()\n"
																								   "{\n"
																								   "    test_output"
				   << array_index_sstream.str() << " = " << output_variable_type_string << "(2.0);\n"
																						   "}\n";

	return result_sstream.str();
}